

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O2

void P_SpawnTeleportFog(AActor *mobj,DVector3 *pos,bool beforeTele,bool setTarget)

{
  AActor *pAVar1;
  DVector3 local_28;
  
  if ((&mobj->TeleFogSourceType)[!beforeTele] != (PClassActor *)0x0) {
    local_28.Z = gameinfo.telefogheight;
    if (((mobj->flags).Value >> 0x10 & 1) != 0) {
      local_28.Z = 0.0;
    }
    local_28.Z = local_28.Z + pos->Z;
    local_28.X = pos->X;
    local_28.Y = pos->Y;
    pAVar1 = Spawn((&mobj->TeleFogSourceType)[!beforeTele],&local_28,ALLOW_REPLACE);
    if (setTarget && pAVar1 != (AActor *)0x0) {
      (pAVar1->target).field_0.p = mobj;
    }
  }
  return;
}

Assistant:

void P_SpawnTeleportFog(AActor *mobj, const DVector3 &pos, bool beforeTele, bool setTarget)
{
	AActor *mo;
	if ((beforeTele ? mobj->TeleFogSourceType : mobj->TeleFogDestType) == NULL)
	{
		//Do nothing.
		mo = NULL;
	}
	else
	{
		double fogDelta = mobj->flags & MF_MISSILE ? 0 : TELEFOGHEIGHT;
		mo = Spawn((beforeTele ? mobj->TeleFogSourceType : mobj->TeleFogDestType), DVector3(pos, pos.Z + fogDelta), ALLOW_REPLACE);
	}

	if (mo != NULL && setTarget)
		mo->target = mobj;
}